

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall Centaurus::NFA<wchar_t>::add_state(NFA<wchar_t> *this,CharClass<wchar_t> *cc)

{
  reference this_00;
  size_type sVar1;
  CharClass<wchar_t> *cc_local;
  NFA<wchar_t> *this_local;
  
  this_00 = std::
            vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
            ::back(&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states);
  sVar1 = std::
          vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
          ::size(&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states);
  NFABaseState<wchar_t,_int>::add_transition(this_00,cc,(int)sVar1,false);
  std::
  vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ::emplace_back<>(&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states);
  return;
}

Assistant:

void add_state(const CharClass<TCHAR>& cc)
    {
        m_states.back().add_transition(cc, m_states.size());
        m_states.emplace_back();
    }